

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_test.cpp
# Opt level: O0

void __thiscall
jhu::thrax::AlignmentTests_TrimFront_Test::AlignmentTests_TrimFront_Test
          (AlignmentTests_TrimFront_Test *this)

{
  AlignmentTests_TrimFront_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__AlignmentTests_TrimFront_Test_001bcb78;
  return;
}

Assistant:

TEST(AlignmentTests, TrimFront) {
  auto a = readAlignment("   0-3 7-7");
  ASSERT_EQ(2, a.size());
  EXPECT_EQ(0, a.front().src);
  EXPECT_EQ(3, a.front().tgt);
  EXPECT_EQ(7, a.back().src);
  EXPECT_EQ(7, a.back().tgt);
}